

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O1

void __thiscall
GraphEditorNodeExpansion::GraphEditorNodeExpansion
          (GraphEditorNodeExpansion *this,sgNodeID_t node,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *links_through)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<long,_std::allocator<long>_> *this_01;
  iterator iVar1;
  pointer ppVar2;
  long *__args;
  pointer ppVar3;
  sgNodeID_t local_30;
  
  this_00 = &(this->super_GraphEditorOperation).input_nodes;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1._M_current =
       (this->super_GraphEditorOperation).input_nodes.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  local_30 = node;
  if (iVar1._M_current ==
      (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
              ((vector<long,std::allocator<long>> *)this_00,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = node;
    (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  ppVar3 = (links_through->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (links_through->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar2) {
    this_01 = &(this->super_GraphEditorOperation).input_ends;
    __args = &ppVar3->second;
    do {
      iVar1._M_current =
           (this->super_GraphEditorOperation).input_ends.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      if (iVar1._M_current ==
          (this->super_GraphEditorOperation).input_ends.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)this_01,iVar1,__args + -1);
      }
      else {
        *iVar1._M_current = ((pair<long,_long> *)(__args + -1))->first;
        (this->super_GraphEditorOperation).input_ends.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar1._M_current + 1;
      }
      iVar1._M_current =
           (this->super_GraphEditorOperation).input_ends.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      if (iVar1._M_current ==
          (this->super_GraphEditorOperation).input_ends.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)this_01,iVar1,__args);
      }
      else {
        *iVar1._M_current = *__args;
        (this->super_GraphEditorOperation).input_ends.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar1._M_current + 1;
      }
      ppVar3 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (ppVar3 != ppVar2);
  }
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_nodes,this_00);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_ends,
             &(this->super_GraphEditorOperation).input_ends);
  return;
}

Assistant:

GraphEditorNodeExpansion::GraphEditorNodeExpansion(sgNodeID_t node,
                                                   std::vector<std::pair<sgNodeID_t, sgNodeID_t>> links_through) {

    input_nodes.emplace_back(node);
    for (auto &l:links_through) {
        input_ends.emplace_back(l.first);
        input_ends.emplace_back(l.second);
    }
    consumed_nodes=input_nodes;
    consumed_ends=input_ends;
}